

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tuint
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int *in_R8;
  undefined4 in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  long ii;
  int in_stack_00000008;
  uint uintflagval;
  uint *uintbuff;
  int *idata;
  undefined8 local_68;
  undefined4 local_4;
  
  if ((((in_stack_00000008 != 0x20) || (in_XMM0_Qa != 1.0)) || (NAN(in_XMM0_Qa))) ||
     ((in_XMM1_Qa != 2147483648.0 || (NAN(in_XMM1_Qa))))) {
    ffpmsg((char *)0x1e4cef);
    *idata = 0x19d;
    local_4 = 0x19d;
  }
  else {
    *uintbuff = 4;
    if (in_ECX == 1) {
      iVar1 = *in_R8;
      for (local_68 = in_RDX + -1; -1 < local_68; local_68 = local_68 + -1) {
        if (*(int *)(in_RSI + local_68 * 4) == iVar1) {
          *(undefined4 *)(in_RSI + local_68 * 4) = in_R9D;
        }
        else {
          *(uint *)(in_RSI + local_68 * 4) = *(uint *)(in_RSI + local_68 * 4) ^ 0x80000000;
        }
      }
    }
    else {
      for (local_68 = in_RDX + -1; -1 < local_68; local_68 = local_68 + -1) {
        *(uint *)(in_RSI + local_68 * 4) = *(uint *)(in_RSI + local_68 * 4) ^ 0x80000000;
      }
    }
    local_4 = *idata;
  }
  return local_4;
}

Assistant:

int imcomp_convert_tile_tuint(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input unsigned integer tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, do null value substitution. */


    int *idata;
    unsigned int *uintbuff, uintflagval;
    long ii;
 
       /* datatype of input array is unsigned int.  We only support writing this datatype
          to a FITS image with BITPIX = 32 and with BZERO = 0 and BSCALE = 2147483648.  */

       if (zbitpix != LONG_IMG || scale != 1.0 || zero != 2147483648.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       *intlength = 4;
       idata = (int *) tiledata;
       uintbuff = (unsigned int *) tiledata;

       /* offset the unsigned value by -2147483648 to a signed int value. */
       /* It is more efficient to do this by just flipping the most significant of the 32 bits */

       if (nullcheck == 1) {
               /* reset pixels equal to flagval to nullval and */
               /* offset the other pixel values (by flipping the MSB) */
               uintflagval = *(unsigned int *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (uintbuff[ii] == uintflagval)
		       idata[ii] = nullval;
                    else
		       uintbuff[ii] = (uintbuff[ii]) ^ 0x80000000;
               }
       } else {
               /* just offset the pixel values (by flipping the MSB) */
               for (ii = tilelen - 1; ii >= 0; ii--)
		       uintbuff[ii] = (uintbuff[ii]) ^ 0x80000000;
       }

       return(*status);
}